

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetPHINFPartNumber(ndicapi *pol,char *part)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    part[lVar1] = pol->PhinfPartNumber[lVar1];
  }
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPartNumber(ndicapi* pol, char part[20])
{
  char* dp;
  int i;

  dp = pol->PhinfPartNumber;

  for (i = 0; i < 20; i++)
  {
    part[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}